

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O0

TypeInfo google::protobuf::internal::UntypedMapBase::GetTypeInfoDynamic
                   (TypeKind key_type,TypeKind value_type,MessageLite *value_prototype_if_message)

{
  uchar uVar1;
  unsigned_short uVar2;
  size_t value;
  Offsets OVar3;
  unsigned_long local_40;
  Offsets value_offsets;
  Offsets key_offsets;
  size_t max_align;
  MessageLite *value_prototype_if_message_local;
  TypeKind value_type_local;
  TypeKind key_type_local;
  
  key_offsets.end = 8;
  OVar3 = AlignAndAddSizeDynamic(8,key_type,(MessageLite *)0x0,&key_offsets.end);
  key_offsets.start = OVar3.end;
  OVar3 = AlignAndAddSizeDynamic
                    (key_offsets.start,value_type,value_prototype_if_message,&key_offsets.end);
  value_offsets.start = OVar3.end;
  value = AlignTo(value_offsets.start,key_offsets.end,&key_offsets.end);
  uVar2 = Narrow<unsigned_short,unsigned_long>(value);
  local_40 = OVar3.start;
  uVar1 = Narrow<unsigned_char,unsigned_long>(local_40);
  value_prototype_if_message_local._4_3_ = CONCAT12(uVar1,uVar2);
  value_prototype_if_message_local._4_4_ =
       (TypeInfo)(CONCAT13(key_type,value_prototype_if_message_local._4_3_) & 0xfffffff);
  value_prototype_if_message_local._4_4_ =
       (TypeInfo)
       CONCAT13(value_prototype_if_message_local._7_1_ | value_type << 4,
                value_prototype_if_message_local._4_3_);
  return value_prototype_if_message_local._4_4_;
}

Assistant:

UntypedMapBase::TypeInfo UntypedMapBase::GetTypeInfoDynamic(
    TypeKind key_type, TypeKind value_type,
    const MessageLite* value_prototype_if_message) {
  size_t max_align = alignof(NodeBase);
  const auto key_offsets =
      AlignAndAddSizeDynamic(sizeof(NodeBase), key_type, nullptr, max_align);
  const auto value_offsets = AlignAndAddSizeDynamic(
      key_offsets.end, value_type, value_prototype_if_message, max_align);
  return TypeInfo{
      Narrow<uint16_t>(AlignTo(value_offsets.end, max_align, max_align)),
      Narrow<uint8_t>(value_offsets.start), static_cast<uint8_t>(key_type),
      static_cast<uint8_t>(value_type)};
}